

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteFinish(Fts5Index *p,Fts5SegWriter *pWriter,int *pnLeaf)

{
  char **ppcVar1;
  Fts5SegWriter *in_RDX;
  Fts5Index *in_RSI;
  long in_RDI;
  Fts5PageWriter *pLeaf;
  int i;
  int local_1c;
  
  ppcVar1 = &in_RSI->zDataTbl;
  if (*(int *)(in_RDI + 0x3c) == 0) {
    if (4 < *(int *)&in_RSI->pHash) {
      fts5WriteFlushLeaf(in_RSI,in_RDX);
    }
    in_RDX->iSegid = *(int *)ppcVar1 + -1;
    if (1 < *(int *)ppcVar1) {
      fts5WriteFlushBtree(in_RSI,in_RDX);
    }
  }
  sqlite3Fts5BufferFree((Fts5Buffer *)0x2798d3);
  sqlite3Fts5BufferFree((Fts5Buffer *)0x2798e0);
  sqlite3Fts5BufferFree((Fts5Buffer *)0x2798ed);
  sqlite3Fts5BufferFree((Fts5Buffer *)0x2798fb);
  for (local_1c = 0; local_1c < *(int *)((long)&in_RSI->pWriter + 4); local_1c = local_1c + 1) {
    sqlite3Fts5BufferFree((Fts5Buffer *)0x27992f);
  }
  sqlite3_free((void *)0x27994a);
  return;
}

Assistant:

static void fts5WriteFinish(
  Fts5Index *p,
  Fts5SegWriter *pWriter,         /* Writer object */
  int *pnLeaf                     /* OUT: Number of leaf pages in b-tree */
){
  int i;
  Fts5PageWriter *pLeaf = &pWriter->writer;
  if( p->rc==SQLITE_OK ){
    assert( pLeaf->pgno>=1 );
    if( pLeaf->buf.n>4 ){
      fts5WriteFlushLeaf(p, pWriter);
    }
    *pnLeaf = pLeaf->pgno-1;
    if( pLeaf->pgno>1 ){
      fts5WriteFlushBtree(p, pWriter);
    }
  }
  fts5BufferFree(&pLeaf->term);
  fts5BufferFree(&pLeaf->buf);
  fts5BufferFree(&pLeaf->pgidx);
  fts5BufferFree(&pWriter->btterm);

  for(i=0; i<pWriter->nDlidx; i++){
    sqlite3Fts5BufferFree(&pWriter->aDlidx[i].buf);
  }
  sqlite3_free(pWriter->aDlidx);
}